

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001bcfe0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001bcfe7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001bcfd0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfd8 = 0x2d2d2d2d2d2d2d;
    DAT_001bcfdf = 0x2d;
    _DAT_001bcfc0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfc8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001bcfb0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfb8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001bcfa8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001bcfef = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}